

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::createConstructor
          (Builder *this,Decoration precision,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sources,Id resultTypeId)

{
  Id *pIVar1;
  uint *puVar2;
  pointer ppIVar3;
  Instruction *pIVar4;
  pointer puVar5;
  value_type_conflict vVar6;
  bool bVar7;
  uint uVar8;
  Id IVar9;
  uint uVar10;
  Op OVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  uint col;
  uint targetComponent;
  uint numTargetComponents;
  uint row;
  Id result;
  vector<unsigned_int,_std::allocator<unsigned_int>_> constituents;
  anon_class_32_4_62b2c330 latchResult;
  value_type_conflict local_b8;
  uint local_b4;
  uint local_b0;
  value_type_conflict local_ac;
  Id local_a8;
  Id local_a4;
  ulong local_a0;
  Id local_94;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_90;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  anon_class_32_4_62b2c330 local_50;
  
  local_a8 = 0;
  uVar8 = getNumTypeConstituents(this,resultTypeId);
  local_b4 = 0;
  pIVar1 = (sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_b0 = uVar8;
  if ((((long)(sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pIVar1 == 4) &&
      (bVar7 = isScalar(this,*pIVar1), bVar7)) &&
     ((1 < uVar8 ||
      ((this->module).idToInstruction.
       super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
       super__Vector_impl_data._M_start[resultTypeId]->opCode == OpTypeCooperativeVectorNV)))) {
    IVar9 = smearScalar(this,precision,
                        *(sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start,resultTypeId);
    return IVar9;
  }
  puVar2 = (sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar2 == 4) {
    uVar10 = *puVar2;
    ppIVar3 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar4 = ppIVar3[uVar10];
    if (pIVar4 == (Instruction *)0x0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (ulong)pIVar4->typeId;
    }
    if ((ppIVar3[uVar13]->opCode == OpTypeVector) &&
       (uVar10 = getNumComponents(this,uVar10), uVar8 == uVar10)) {
      uVar8 = *(sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pIVar4 = (this->module).idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8];
      if (pIVar4 == (Instruction *)0x0) {
        IVar9 = 0;
      }
      else {
        IVar9 = pIVar4->typeId;
      }
      if (IVar9 == resultTypeId) {
        return uVar8;
      }
      __assert_fail("resultTypeId == getTypeId(sources[0])",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0xde3,
                    "Id spv::Builder::createConstructor(Decoration, const std::vector<Id> &, Id)");
    }
  }
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_94 = resultTypeId;
  local_a4 = getScalarTypeId(this,resultTypeId);
  local_50.numTargetComponents = &local_b0;
  local_50.result = &local_a8;
  local_50.targetComponent = &local_b4;
  uVar8 = 0;
  local_90 = sources;
  local_50.constituents = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88;
  do {
    uVar13 = (ulong)uVar8;
    puVar5 = (sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 2) <= uVar13)
    break;
    bVar7 = isScalar(this,puVar5[uVar13]);
    uVar10 = (sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar13];
    if (bVar7) {
LAB_0036292c:
      createConstructor::anon_class_32_4_62b2c330::operator()(&local_50,uVar10);
    }
    else {
      ppIVar3 = (this->module).idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppIVar3[uVar10] == (Instruction *)0x0) {
        OVar11 = (*ppIVar3)->opCode;
        if (OVar11 != OpTypeVector) {
          if (OVar11 == OpTypePointer) goto LAB_0036292c;
          if (OVar11 != OpTypeCooperativeVectorNV) goto LAB_003629ff;
        }
LAB_00362984:
        local_a0 = uVar13;
        uVar12 = getNumComponents(this,uVar10);
        uVar8 = local_b0 - local_b4;
        if (local_b4 + uVar12 <= local_b0) {
          uVar8 = uVar12;
        }
        for (local_b8 = 0; local_b8 < uVar8; local_b8 = local_b8 + 1) {
          local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,&local_b8);
          IVar9 = createRvalueSwizzle(this,precision,local_a4,uVar10,
                                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      &local_68);
          createConstructor::anon_class_32_4_62b2c330::operator()(&local_50,IVar9);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
        }
      }
      else {
        OVar11 = ppIVar3[ppIVar3[uVar10]->typeId]->opCode;
        if ((OVar11 == OpTypeVector) || (OVar11 == OpTypeCooperativeVectorNV)) goto LAB_00362984;
        if (OVar11 == OpTypePointer) goto LAB_0036292c;
LAB_003629ff:
        if (OVar11 != OpTypeMatrix) {
          local_a0 = uVar13;
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                        ,0xe23,
                        "Id spv::Builder::createConstructor(Decoration, const std::vector<Id> &, Id)"
                       );
        }
        local_a0 = uVar13;
        uVar8 = getNumColumns(this,uVar10);
        uVar12 = getNumRows(this,uVar10);
        iVar14 = local_b0 - local_b4;
        if (local_b4 + uVar12 * uVar8 <= local_b0) {
          iVar14 = uVar12 * uVar8;
        }
        local_b8 = 0;
        local_ac = 0;
        while (vVar6 = local_ac, bVar7 = iVar14 != 0, iVar14 = iVar14 + -1, sources = local_90,
              bVar7) {
          uVar8 = getNumRows(this,uVar10);
          if (uVar8 <= vVar6) {
            local_ac = 0;
            local_b8 = local_b8 + 1;
          }
          local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,&local_b8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,&local_ac);
          IVar9 = createCompositeExtract
                            (this,uVar10,local_a4,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68);
          createConstructor::anon_class_32_4_62b2c330::operator()(&local_50,IVar9);
          local_ac = local_ac + 1;
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
        }
      }
      uVar8 = (uint)local_a0;
    }
    uVar8 = uVar8 + 1;
  } while (local_b4 < local_b0);
  IVar9 = local_a8;
  if (local_88._M_impl.super__Vector_impl_data._M_finish !=
      local_88._M_impl.super__Vector_impl_data._M_start) {
    local_a8 = createCompositeConstruct
                         (this,local_94,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88);
    IVar9 = setPrecision(this,local_a8,precision);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_88);
  return IVar9;
}

Assistant:

Id Builder::createConstructor(Decoration precision, const std::vector<Id>& sources, Id resultTypeId)
{
    Id result = NoResult;
    unsigned int numTargetComponents = getNumTypeComponents(resultTypeId);
    unsigned int targetComponent = 0;

    // Special case: when calling a vector constructor with a single scalar
    // argument, smear the scalar
    if (sources.size() == 1 && isScalar(sources[0]) && (numTargetComponents > 1 || isCooperativeVectorType(resultTypeId)))
        return smearScalar(precision, sources[0], resultTypeId);

    // Special case: 2 vectors of equal size
    if (sources.size() == 1 && isVector(sources[0]) && numTargetComponents == getNumComponents(sources[0])) {
        assert(resultTypeId == getTypeId(sources[0]));
        return sources[0];
    }

    // accumulate the arguments for OpCompositeConstruct
    std::vector<Id> constituents;
    Id scalarTypeId = getScalarTypeId(resultTypeId);

    // lambda to store the result of visiting an argument component
    const auto latchResult = [&](Id comp) {
        if (numTargetComponents > 1)
            constituents.push_back(comp);
        else
            result = comp;
        ++targetComponent;
    };

    // lambda to visit a vector argument's components
    const auto accumulateVectorConstituents = [&](Id sourceArg) {
        unsigned int sourceSize = getNumComponents(sourceArg);
        unsigned int sourcesToUse = sourceSize;
        if (sourcesToUse + targetComponent > numTargetComponents)
            sourcesToUse = numTargetComponents - targetComponent;

        for (unsigned int s = 0; s < sourcesToUse; ++s) {
            std::vector<unsigned> swiz;
            swiz.push_back(s);
            latchResult(createRvalueSwizzle(precision, scalarTypeId, sourceArg, swiz));
        }
    };

    // lambda to visit a matrix argument's components
    const auto accumulateMatrixConstituents = [&](Id sourceArg) {
        unsigned int sourceSize = getNumColumns(sourceArg) * getNumRows(sourceArg);
        unsigned int sourcesToUse = sourceSize;
        if (sourcesToUse + targetComponent > numTargetComponents)
            sourcesToUse = numTargetComponents - targetComponent;

        unsigned int col = 0;
        unsigned int row = 0;
        for (unsigned int s = 0; s < sourcesToUse; ++s) {
            if (row >= getNumRows(sourceArg)) {
                row = 0;
                col++;
            }
            std::vector<Id> indexes;
            indexes.push_back(col);
            indexes.push_back(row);
            latchResult(createCompositeExtract(sourceArg, scalarTypeId, indexes));
            row++;
        }
    };

    // Go through the source arguments, each one could have either
    // a single or multiple components to contribute.
    for (unsigned int i = 0; i < sources.size(); ++i) {

        if (isScalar(sources[i]) || isPointer(sources[i]))
            latchResult(sources[i]);
        else if (isVector(sources[i]) || isCooperativeVector(sources[i]))
            accumulateVectorConstituents(sources[i]);
        else if (isMatrix(sources[i]))
            accumulateMatrixConstituents(sources[i]);
        else
            assert(0);

        if (targetComponent >= numTargetComponents)
            break;
    }

    // If the result is a vector, make it from the gathered constituents.
    if (constituents.size() > 0) {
        result = createCompositeConstruct(resultTypeId, constituents);
        return setPrecision(result, precision);
    } else {
      // Precision was set when generating this component.
      return result;
    }
}